

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O3

void destroy_network_interface_descriptions(NETWORK_INTERFACE_DESCRIPTION *nid)

{
  if (nid != (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
    if (nid->next != (NETWORK_INTERFACE_DESCRIPTION *)0x0) {
      destroy_network_interface_descriptions(nid->next);
    }
    if (nid->name != (char *)0x0) {
      free(nid->name);
    }
    if (nid->mac_address != (char *)0x0) {
      free(nid->mac_address);
    }
    if (nid->ip_address != (char *)0x0) {
      free(nid->ip_address);
    }
    free(nid);
    return;
  }
  return;
}

Assistant:

static void destroy_network_interface_descriptions(NETWORK_INTERFACE_DESCRIPTION* nid)
{
    if (nid != NULL)
    {
        if (nid->next != NULL)
        {
            destroy_network_interface_descriptions(nid->next);
        }

        if (nid->name != NULL)
        {
            free(nid->name);
        }

        if (nid->mac_address != NULL)
        {
            free(nid->mac_address);
        }

        if (nid->ip_address != NULL)
        {
            free(nid->ip_address);
        }

        free(nid);
    }
}